

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Type __thiscall capnp::Schema::interpretType(Schema *this,Reader proto,uint location)

{
  short sVar1;
  Reader proto_00;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  anon_union_8_2_eba6ea51_for_Type_5 aVar6;
  byte bVar7;
  uint index;
  uint64_t uVar8;
  anon_union_2_2_d12d5221_for_Type_3 aVar9;
  Reader *pRVar10;
  ulong uVar11;
  Type TVar12;
  Type TVar13;
  Reader local_78;
  Reader local_48;
  
  if (proto._reader.dataSize < 0x10) {
    uVar4 = 0;
switchD_002fa8fb_caseD_0:
    uVar2 = 0;
LAB_002fa902:
    uVar3 = uVar2;
    aVar9.paramIndex = 0;
LAB_002fa904:
    bVar7 = 0;
    uVar11 = 0;
    TVar13.field_4.schema = (RawBrandedSchema *)0x0;
    TVar13.baseType = (short)uVar4;
    TVar13.listDepth = (char)(uVar4 >> 0x10);
    TVar13.isImplicitParam = (bool)(char)(uVar4 >> 0x18);
    TVar13.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar4 >> 0x20);
    TVar13._6_2_ = (short)(uVar4 >> 0x30);
  }
  else {
    uVar4 = (ulong)*proto._reader.data;
    switch(uVar4) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      goto switchD_002fa8fb_caseD_0;
    case 0xe:
      local_78._reader._32_8_ = proto._reader._32_8_;
      local_78._reader.nestingLimit = proto._reader.nestingLimit;
      local_78._reader._44_4_ = proto._reader._44_4_;
      local_78._reader.data = proto._reader.data;
      local_78._reader.pointers = proto._reader.pointers;
      local_78._reader.segment = proto._reader.segment;
      local_78._reader.capTable = proto._reader.capTable;
      capnp::schema::Type::List::Reader::getElementType(&local_48,&local_78);
      proto_00._reader.capTable = local_48._reader.capTable;
      proto_00._reader.segment = local_48._reader.segment;
      proto_00._reader.data = local_48._reader.data;
      proto_00._reader.pointers = local_48._reader.pointers;
      proto_00._reader.dataSize = local_48._reader.dataSize;
      proto_00._reader.pointerCount = local_48._reader.pointerCount;
      proto_00._reader._38_2_ = local_48._reader._38_2_;
      proto_00._reader.nestingLimit = local_48._reader.nestingLimit;
      proto_00._reader._44_4_ = local_48._reader._44_4_;
      TVar13 = interpretType(this,proto_00,location);
      uVar11 = TVar13._0_8_;
      aVar9 = TVar13.field_3;
      bVar7 = TVar13.listDepth + 1;
LAB_002faa06:
      uVar11 = uVar11 & 0xffff000000000000;
      uVar3 = TVar13._0_4_;
      goto LAB_002fa909;
    case 0xf:
      if (proto._reader.dataSize < 0x80) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_78._reader.segment = (SegmentReader *)getDependency(this,uVar8,location);
      pRVar10 = &local_78;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)asEnum((Schema *)pRVar10);
      aVar9.paramIndex = (uint16_t)pRVar10;
      uVar5 = 0xf;
      break;
    case 0x10:
      if (proto._reader.dataSize < 0x80) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_78._reader.segment = (SegmentReader *)getDependency(this,uVar8,location);
      pRVar10 = &local_78;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)asStruct((Schema *)pRVar10);
      aVar9.paramIndex = (uint16_t)pRVar10;
      uVar5 = 0x10;
      break;
    case 0x11:
      if (proto._reader.dataSize < 0x80) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_78._reader.segment = (SegmentReader *)getDependency(this,uVar8,location);
      pRVar10 = &local_78;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)asInterface((Schema *)pRVar10);
      aVar9.paramIndex = (uint16_t)pRVar10;
      uVar5 = 0x11;
      break;
    case 0x12:
      uVar4 = 0x12;
      if (proto._reader.dataSize < 0x50) goto switchD_002fa8fb_caseD_0;
      sVar1 = *(short *)((long)proto._reader.data + 8);
      if (sVar1 == 2) {
        uVar3 = 0x1000000;
        uVar2 = 0x1000000;
        if (0x5f < proto._reader.dataSize) {
          aVar9 = (anon_union_2_2_d12d5221_for_Type_3)
                  ((anon_union_2_2_d12d5221_for_Type_3 *)((long)proto._reader.data + 10))->
                  paramIndex;
          goto LAB_002fa904;
        }
        goto LAB_002fa902;
      }
      if (sVar1 == 1) {
        if (proto._reader.dataSize < 0xc0) {
          uVar8 = 0;
          index = 0;
          if (0x5f < proto._reader.dataSize) goto LAB_002faabb;
        }
        else {
          uVar8 = *(uint64_t *)((long)proto._reader.data + 0x10);
LAB_002faabb:
          index = (uint)*(ushort *)((long)proto._reader.data + 10);
        }
        TVar13 = getBrandBinding(this,uVar8,index);
        uVar11 = TVar13._0_8_;
        bVar7 = TVar13.listDepth;
        aVar9 = TVar13.field_3;
        goto LAB_002faa06;
      }
      if (sVar1 != 0) goto switchD_002fa8fb_default;
      if (proto._reader.dataSize < 0x60) goto switchD_002fa8fb_caseD_0;
      aVar9 = (anon_union_2_2_d12d5221_for_Type_3)
              ((anon_union_2_2_d12d5221_for_Type_3 *)((long)proto._reader.data + 10))->paramIndex;
      uVar3 = 0;
      goto LAB_002fa904;
    default:
switchD_002fa8fb_default:
      kj::_::unreachable();
    }
    TVar13.field_4.schema = aVar6.schema;
    TVar13.baseType = (short)uVar5;
    TVar13.listDepth = (char)((ulong)uVar5 >> 0x10);
    TVar13.isImplicitParam = (bool)(char)((ulong)uVar5 >> 0x18);
    TVar13.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar5 >> 0x20);
    TVar13._6_2_ = (short)((ulong)uVar5 >> 0x30);
    bVar7 = 0;
    uVar3 = 0;
    uVar11 = 0;
  }
LAB_002fa909:
  TVar12.field_4 = TVar13.field_4;
  TVar12._0_8_ = TVar13._0_8_ & 0xffff | (ulong)bVar7 << 0x10 |
                 uVar3 & 0xff000000 | uVar11 | (ulong)aVar9.paramIndex << 0x20;
  return TVar12;
}

Assistant:

Type Schema::interpretType(schema::Type::Reader proto, uint location) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return getDependency(structType.getTypeId(), location).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return getDependency(enumType.getTypeId(), location).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return getDependency(interfaceType.getTypeId(), location).asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(interpretType(proto.getList().getElementType(), location));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return anyPointer.getUnconstrained().which();
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          return Type(Type::ImplicitParameter {
              anyPointer.getImplicitMethodParameter().getParameterIndex() });
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}